

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.cpp
# Opt level: O3

void __thiscall chrono::ChPhysicsItem::GetCenter(ChPhysicsItem *this,ChVector<double> *mcenter)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChVector<double> mmax;
  ChVector<double> mmin;
  double local_58;
  double dStack_50;
  double local_48;
  double local_38;
  double dStack_30;
  double local_28;
  
  local_48 = 0.0;
  local_38 = 0.0;
  dStack_30 = 0.0;
  local_28 = 0.0;
  local_58 = 0.0;
  dStack_50 = 0.0;
  (*(this->super_ChObj)._vptr_ChObj[0xe])(this,&local_38,&local_58);
  auVar2._0_8_ = local_38 + local_58;
  auVar2._8_8_ = dStack_30 + dStack_50;
  auVar1._8_8_ = 0x3fe0000000000000;
  auVar1._0_8_ = 0x3fe0000000000000;
  auVar1 = vmulpd_avx512vl(auVar2,auVar1);
  *(undefined1 (*) [16])mcenter->m_data = auVar1;
  mcenter->m_data[2] = (local_28 + local_48) * 0.5;
  return;
}

Assistant:

void ChPhysicsItem::GetCenter(ChVector<>& mcenter) {
    ChVector<> mmin, mmax;
    GetTotalAABB(mmin, mmax);
    mcenter = (mmin + mmax) * 0.5;
}